

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O2

void __thiscall ELFIO::elfio::clean(elfio *this)

{
  pointer ppsVar1;
  pointer ppsVar2;
  pointer ppsVar3;
  pointer ppsVar4;
  
  if (this->header != (elf_header *)0x0) {
    (*this->header->_vptr_elf_header[1])();
  }
  this->header = (elf_header *)0x0;
  for (ppsVar3 = (this->sections_).
                 super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppsVar3 !=
      (this->sections_).super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppsVar3 = ppsVar3 + 1) {
    if (*ppsVar3 != (section *)0x0) {
      (*(*ppsVar3)->_vptr_section[1])();
    }
  }
  ppsVar1 = (this->sections_).
            super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppsVar3 != ppsVar1) {
    (this->sections_).super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppsVar1;
  }
  for (ppsVar4 = (this->segments_).
                 super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppsVar4 !=
      (this->segments_).super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppsVar4 = ppsVar4 + 1) {
    if (*ppsVar4 != (segment *)0x0) {
      (*(*ppsVar4)->_vptr_segment[1])();
    }
  }
  ppsVar2 = (this->segments_).
            super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppsVar4 != ppsVar2) {
    (this->segments_).super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppsVar2;
  }
  return;
}

Assistant:

void clean()
    {
		if(header)
			delete header;

        header = 0;

        std::vector<section*>::const_iterator it;
        for ( it = sections_.begin(); it != sections_.end(); ++it ) {
            delete *it;
        }
        sections_.clear();

        std::vector<segment*>::const_iterator it1;
        for ( it1 = segments_.begin(); it1 != segments_.end(); ++it1 ) {
            delete *it1;
        }
        segments_.clear();
    }